

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

UDate __thiscall icu_63::CalendarAstronomer::getSunRiseSet(CalendarAstronomer *this,UBool rise)

{
  double dVar1;
  double dVar2;
  UDate UVar3;
  RiseSetCoordFunc func;
  CoordFunc local_20;
  
  dVar1 = this->fTime;
  dVar2 = uprv_floor_63((this->fGmtOffset + dVar1) / 86400000.0);
  this->fTime = (dVar2 * 86400000.0 - this->fGmtOffset) + 43200000.0 +
                *(double *)(&DAT_00309450 + (ulong)(rise == '\0') * 8);
  clearCache(this);
  local_20._vptr_CoordFunc = (_func_int **)&PTR_eval_003d3478;
  UVar3 = riseOrSet(this,&local_20,rise,0.009302604913129777,0.009890199094634533,5000.0);
  this->fTime = dVar1;
  clearCache(this);
  return UVar3;
}

Assistant:

UDate CalendarAstronomer::getSunRiseSet(UBool rise)
{
    UDate t0 = fTime;

    // Make a rough guess: 6am or 6pm local time on the current day
    double noon = ClockMath::floorDivide(fTime + fGmtOffset, (double)DAY_MS)*DAY_MS - fGmtOffset + (12*HOUR_MS);

    U_DEBUG_ASTRO_MSG(("Noon=%.2lf, %sL, gmtoff %.2lf\n", noon, debug_astro_date(noon+fGmtOffset), fGmtOffset));
    setTime(noon +  ((rise ? -6 : 6) * HOUR_MS));
    U_DEBUG_ASTRO_MSG(("added %.2lf ms as a guess,\n", ((rise ? -6. : 6.) * HOUR_MS)));

    RiseSetCoordFunc func;
    double t = riseOrSet(func,
                         rise,
                         .533 * DEG_RAD,        // Angular Diameter
                         34. /60.0 * DEG_RAD,    // Refraction correction
                         MINUTE_MS / 12.);       // Desired accuracy

    setTime(t0);
    return t;
}